

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprVectorRegister(Parse *pParse,Expr *pVector,int iField,int regSelect,Expr **ppExpr,
                      int *pRegFree)

{
  char cVar1;
  undefined8 uVar2;
  Expr *pEVar3;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  Expr *in_R8;
  int *in_R9;
  u8 op;
  undefined7 in_stack_ffffffffffffffc8;
  int local_4;
  
  cVar1 = *in_RSI;
  if (cVar1 == -0x50) {
    pEVar3 = sqlite3VectorFieldSubexpr((Expr *)CONCAT17(0xb0,in_stack_ffffffffffffffc8),0);
    *(Expr **)in_R8 = pEVar3;
    local_4 = *(int *)(in_RSI + 0x2c) + in_EDX;
  }
  else if (cVar1 == -0x75) {
    uVar2 = *(undefined8 *)(*(long *)(*(long *)(in_RSI + 0x20) + 0x20) + 8 + (long)in_EDX * 0x18);
    in_R8->op = (char)uVar2;
    in_R8->affExpr = (char)((ulong)uVar2 >> 8);
    in_R8->op2 = (char)((ulong)uVar2 >> 0x10);
    in_R8->field_0x3 = (char)((ulong)uVar2 >> 0x18);
    in_R8->flags = (int)((ulong)uVar2 >> 0x20);
    local_4 = in_ECX + in_EDX;
  }
  else if (cVar1 == -0x4f) {
    uVar2 = *(undefined8 *)(*(long *)(in_RSI + 0x20) + 8 + (long)in_EDX * 0x18);
    in_R8->op = (char)uVar2;
    in_R8->affExpr = (char)((ulong)uVar2 >> 8);
    in_R8->op2 = (char)((ulong)uVar2 >> 0x10);
    in_R8->field_0x3 = (char)((ulong)uVar2 >> 0x18);
    in_R8->flags = (int)((ulong)uVar2 >> 0x20);
    local_4 = sqlite3ExprCodeTemp((Parse *)CONCAT44(in_EDX,in_ECX),in_R8,in_R9);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int exprVectorRegister(
  Parse *pParse,                  /* Parse context */
  Expr *pVector,                  /* Vector to extract element from */
  int iField,                     /* Field to extract from pVector */
  int regSelect,                  /* First in array of registers */
  Expr **ppExpr,                  /* OUT: Expression element */
  int *pRegFree                   /* OUT: Temp register to free */
){
  u8 op = pVector->op;
  assert( op==TK_VECTOR || op==TK_REGISTER || op==TK_SELECT || op==TK_ERROR );
  if( op==TK_REGISTER ){
    *ppExpr = sqlite3VectorFieldSubexpr(pVector, iField);
    return pVector->iTable+iField;
  }
  if( op==TK_SELECT ){
    assert( ExprUseXSelect(pVector) );
    *ppExpr = pVector->x.pSelect->pEList->a[iField].pExpr;
     return regSelect+iField;
  }
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pVector) );
    *ppExpr = pVector->x.pList->a[iField].pExpr;
    return sqlite3ExprCodeTemp(pParse, *ppExpr, pRegFree);
  }
  return 0;
}